

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O2

void __thiscall QAbstractButtonPrivate::click(QAbstractButtonPrivate *this)

{
  QWidget *this_00;
  bool bVar1;
  QWidget *pQVar2;
  byte bVar3;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar3 = this->field_0x28c;
  this->field_0x28c = bVar3 & 0xcf | 0x20;
  if (((bVar3 & 2) == 0) || (pQVar2 = &queryCheckedButton(this)->super_QWidget, pQVar2 != this_00))
  {
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    QPointer<QAbstractButton>::QPointer<void>
              ((QPointer<QAbstractButton> *)&local_38,(QAbstractButton *)this_00);
LAB_0039b773:
    (**(code **)(*(long *)this_00 + 0x1b0))(this_00);
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
    if (!bVar1) goto LAB_0039b811;
  }
  else {
    if (this->group == (QButtonGroup *)0x0) {
      bVar3 = (byte)this->field_0x28c >> 3 & 1;
    }
    else {
      bVar3 = *(byte *)(*(long *)&this->group->field_0x8 + 0xa0);
    }
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    QPointer<QAbstractButton>::QPointer<void>
              ((QPointer<QAbstractButton> *)&local_38,(QAbstractButton *)this_00);
    if (bVar3 == 0) goto LAB_0039b773;
  }
  this->field_0x28c = this->field_0x28c & 0xdf;
  refresh(this);
  QWidget::repaint(this_00);
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
  if (bVar1) {
    emitReleased(this);
  }
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
  if (bVar1) {
    emitClicked(this);
  }
LAB_0039b811:
  QWeakPointer<QObject>::~QWeakPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractButtonPrivate::click()
{
    Q_Q(QAbstractButton);

    down = false;
    blockRefresh = true;
    bool changeState = true;
    if (checked && queryCheckedButton() == q) {
        // the checked button of an exclusive or autoexclusive group cannot be unchecked
#if QT_CONFIG(buttongroup)
        if (group ? group->d_func()->exclusive : autoExclusive)
#else
        if (autoExclusive)
#endif
            changeState = false;
    }

    QPointer<QAbstractButton> guard(q);
    if (changeState) {
        q->nextCheckState();
        if (!guard)
            return;
    }
    blockRefresh = false;
    refresh();
    q->repaint();
    if (guard)
        emitReleased();
    if (guard)
        emitClicked();
}